

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int JS_SetPropertyInt64(JSContext *ctx,JSValue this_obj,int64_t idx,JSValue val)

{
  JSValue val_00;
  JSValue v;
  JSValue val_01;
  JSValue this_obj_00;
  JSValue prop_00;
  JSAtom JVar1;
  ulong in_RCX;
  JSContext *in_RDI;
  int64_t in_R8;
  JSContext *in_R9;
  JSValue in_stack_00000000;
  int res;
  JSAtom prop;
  undefined8 in_stack_ffffffffffffff88;
  JSAtom prop_01;
  JSContext *in_stack_ffffffffffffff90;
  JSValueUnion in_stack_ffffffffffffff98;
  int64_t in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  int flags;
  undefined4 uVar2;
  undefined4 local_20;
  undefined4 in_stack_fffffffffffffff4;
  
  prop_01 = (JSAtom)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  flags = (int)in_RCX;
  uVar2 = (undefined4)(in_RCX >> 0x20);
  if (in_RCX < 0x80000000) {
    prop_00.u._4_4_ = in_stack_fffffffffffffff4;
    prop_00.u.int32 = flags;
    prop_00.tag = 0;
    val_00.tag = idx;
    val_00.u.float64 = _res;
    local_20 = JS_SetPropertyValue(in_RDI,in_stack_00000000,prop_00,val_00,flags);
  }
  else {
    JVar1 = JS_NewAtomInt64(in_R9,in_R8);
    if (JVar1 == 0) {
      v.tag = in_stack_ffffffffffffffa0;
      v.u.ptr = in_stack_ffffffffffffff98.ptr;
      JS_FreeValue(in_stack_ffffffffffffff90,v);
      local_20 = -1;
    }
    else {
      this_obj_00.u._4_4_ = JVar1;
      this_obj_00.u.int32 = in_stack_ffffffffffffffa8;
      this_obj_00.tag._0_4_ = flags;
      this_obj_00.tag._4_4_ = uVar2;
      val_01.tag = in_stack_ffffffffffffffa0;
      val_01.u.ptr = in_stack_ffffffffffffff98.ptr;
      local_20 = JS_SetProperty(in_stack_ffffffffffffff90,this_obj_00,prop_01,val_01);
      JS_FreeAtom(in_stack_ffffffffffffff90,prop_01);
    }
  }
  return local_20;
}

Assistant:

int JS_SetPropertyInt64(JSContext *ctx, JSValueConst this_obj,
                        int64_t idx, JSValue val)
{
    JSAtom prop;
    int res;

    if ((uint64_t)idx <= INT32_MAX) {
        /* fast path for fast arrays */
        return JS_SetPropertyValue(ctx, this_obj, JS_NewInt32(ctx, idx), val,
                                   JS_PROP_THROW);
    }
    prop = JS_NewAtomInt64(ctx, idx);
    if (prop == JS_ATOM_NULL) {
        JS_FreeValue(ctx, val);
        return -1;
    }
    res = JS_SetProperty(ctx, this_obj, prop, val);
    JS_FreeAtom(ctx, prop);
    return res;
}